

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint32_t sve_zcr_len_for_el_arm(CPUARMState *env,int el)

{
  int iVar1;
  uint32_t uVar2;
  ArchCPU_conflict *cpu_00;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint32_t zcr_len;
  ARMCPU *cpu;
  int el_local;
  CPUARMState *env_local;
  
  cpu_00 = env_archcpu(env);
  local_28 = cpu_00->sve_max_vq - 1;
  local_24 = local_28;
  if (el < 2) {
    if (((uint)(env->vfp).zcr_el[1] & 0xf) <= local_28) {
      local_28 = (uint)(env->vfp).zcr_el[1] & 0xf;
    }
    local_24 = local_28;
  }
  if ((el < 3) && (iVar1 = arm_feature(env,0x20), iVar1 != 0)) {
    if (local_24 < ((uint)(env->vfp).zcr_el[2] & 0xf)) {
      local_2c = local_24;
    }
    else {
      local_2c = (uint)(env->vfp).zcr_el[2] & 0xf;
    }
    local_24 = local_2c;
  }
  iVar1 = arm_feature(env,0x21);
  if (iVar1 != 0) {
    if (local_24 < ((uint)(env->vfp).zcr_el[3] & 0xf)) {
      local_30 = local_24;
    }
    else {
      local_30 = (uint)(env->vfp).zcr_el[3] & 0xf;
    }
    local_24 = local_30;
  }
  uVar2 = sve_zcr_get_valid_len(cpu_00,local_24);
  return uVar2;
}

Assistant:

uint32_t sve_zcr_len_for_el(CPUARMState *env, int el)
{
    ARMCPU *cpu = env_archcpu(env);
    uint32_t zcr_len = cpu->sve_max_vq - 1;

    if (el <= 1) {
        zcr_len = MIN(zcr_len, 0xf & (uint32_t)env->vfp.zcr_el[1]);
    }
    if (el <= 2 && arm_feature(env, ARM_FEATURE_EL2)) {
        zcr_len = MIN(zcr_len, 0xf & (uint32_t)env->vfp.zcr_el[2]);
    }
    if (arm_feature(env, ARM_FEATURE_EL3)) {
        zcr_len = MIN(zcr_len, 0xf & (uint32_t)env->vfp.zcr_el[3]);
    }

    return sve_zcr_get_valid_len(cpu, zcr_len);
}